

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

int __thiscall CLI::Option::get_items_expected(Option *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  Option *this_local;
  
  iVar1 = this->type_size_ * this->expected_;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  bVar3 = true;
  if (((this->super_OptionBase<CLI::Option>).multi_option_policy_ == Throw) &&
     (bVar3 = false, this->expected_ < 0)) {
    bVar3 = this->type_size_ < 0;
  }
  iVar2 = 1;
  if (bVar3) {
    iVar2 = -1;
  }
  return iVar1 * iVar2;
}

Assistant:

int get_items_expected() const {
        return std::abs(type_size_ * expected_) *
               ((multi_option_policy_ != MultiOptionPolicy::Throw || (expected_ < 0 && type_size_ < 0) ? -1 : 1));
    }